

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  ushort uVar1;
  bool bVar2;
  ushort *key1;
  ulong uVar3;
  XMLSize_t XVar4;
  ushort *puVar5;
  RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *pRVar6;
  DatatypeValidator *dv;
  XMLSize_t XVar7;
  RefHashTableOfEnumerator<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> local_60;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_60.fMemoryManager = objToStore->fMemoryManager;
    local_60.super_XMLEnumerator<xercesc_4_0::DatatypeValidator>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00413ea8;
    local_60.fAdopted = false;
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
    local_60.fCurHash = 0;
    pRVar6 = local_60.fCurElem;
    if (objToStore->fHashModulus != 0) {
      XVar7 = 1;
      do {
        XVar4 = XVar7;
        pRVar6 = objToStore->fBucketList[XVar4 - 1];
        if (objToStore->fBucketList[XVar4 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) break;
        XVar7 = XVar4 + 1;
        pRVar6 = local_60.fCurElem;
        local_60.fCurHash = XVar4;
      } while (XVar4 != objToStore->fHashModulus);
    }
    local_60.fCurElem = pRVar6;
    XVar7 = 0;
    local_60.fToEnum = objToStore;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHashTableOfEnumerator<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
      nextElement(&local_60);
      XVar7 = XVar7 + 1;
    }
    XSerializeEngine::writeSize(serEng,XVar7);
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
    local_60.fCurHash = 0;
    pRVar6 = local_60.fCurElem;
    if ((local_60.fToEnum)->fHashModulus != 0) {
      XVar7 = 1;
      do {
        XVar4 = XVar7;
        pRVar6 = (local_60.fToEnum)->fBucketList[XVar4 - 1];
        if ((local_60.fToEnum)->fBucketList[XVar4 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) break;
        XVar7 = XVar4 + 1;
        pRVar6 = local_60.fCurElem;
        local_60.fCurHash = XVar4;
      } while (XVar4 != (local_60.fToEnum)->fHashModulus);
    }
    local_60.fCurElem = pRVar6;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      key1 = (ushort *)
             RefHashTableOfEnumerator<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
             nextElementKey(&local_60);
      if ((key1 == (ushort *)0x0) || (uVar3 = (ulong)*key1, uVar3 == 0)) {
        uVar3 = 0;
      }
      else {
        uVar1 = key1[1];
        if (uVar1 != 0) {
          puVar5 = key1 + 2;
          do {
            uVar3 = (ulong)uVar1 + (uVar3 >> 0x18) + uVar3 * 0x26;
            uVar1 = *puVar5;
            puVar5 = puVar5 + 1;
          } while (uVar1 != 0);
        }
        uVar3 = uVar3 % objToStore->fHashModulus;
      }
      for (pRVar6 = objToStore->fBucketList[uVar3];
          pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
          pRVar6 = pRVar6->fNext) {
        bVar2 = StringHasher::equals((StringHasher *)&objToStore->field_0x30,key1,pRVar6->fKey);
        if (bVar2) goto LAB_002d5ab4;
      }
      pRVar6 = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
LAB_002d5ab4:
      if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
        dv = (DatatypeValidator *)0x0;
      }
      else {
        dv = pRVar6->fData;
      }
      DatatypeValidator::storeDV(serEng,dv);
    }
    RefHashTableOfEnumerator<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<DatatypeValidator>* const objToStore
                                    , XSerializeEngine&                        serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {

        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<DatatypeValidator> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            DatatypeValidator* data = objToStore->get(strKey);
            DatatypeValidator::storeDV(serEng, data);
        }
#else
        while (e.hasMoreElements())
        {
            /***
             * to do: verify valid id
             *
             *    XMLCh*  key = (XMLCh*) e.nextElementKey();
             *    unsigned int id = serEng.getStringPool()->getId(key);
             *    if (id == 0)
             *        throw exception
             ***/
            DatatypeValidator* data = objToStore->get(e.nextElementKey());
            DatatypeValidator::storeDV(serEng, data);
        }
#endif
    }
}